

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParameters.cpp
# Opt level: O1

void __thiscall
glcts::TextureBufferParameters::TextureBufferParameters
          (TextureBufferParameters *this,Context *context,ExtParameters *extParams,char *name,
          char *description)

{
  _Rb_tree_header *p_Var1;
  
  TestCaseBase::TestCaseBase(&this->super_TestCaseBase,context,extParams,name,description);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBufferParameters_0215a6c0;
  p_Var1 = &(this->m_internal_formats)._M_t._M_impl.super__Rb_tree_header;
  (this->m_internal_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_internal_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_internal_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_internal_formats)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_internal_formats)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_tbo_id = 0;
  this->m_to_id = 0;
  return;
}

Assistant:

TextureBufferParameters::TextureBufferParameters(Context& context, const ExtParameters& extParams, const char* name,
												 const char* description)
	: TestCaseBase(context, extParams, name, description), m_tbo_id(0), m_to_id(0)
{
}